

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::base::utils::Str::wildCardMatch(char *str,char *pattern)

{
  bool bVar1;
  char *local_20;
  char *pattern_local;
  char *str_local;
  
  local_20 = pattern;
  pattern_local = str;
  while( true ) {
    if (*local_20 == '\0') {
      str_local._7_1_ = false;
      if (*pattern_local == '\0') {
        str_local._7_1_ = *local_20 == '\0';
      }
      return str_local._7_1_;
    }
    if (*local_20 == '*') break;
    if (*local_20 == '?') {
      if (*pattern_local == '\0') {
        return false;
      }
    }
    else if (*pattern_local != *local_20) {
      return false;
    }
    pattern_local = pattern_local + 1;
    local_20 = local_20 + 1;
  }
  bVar1 = wildCardMatch(pattern_local,local_20 + 1);
  if (bVar1) {
    return true;
  }
  if ((*pattern_local != '\0') && (bVar1 = wildCardMatch(pattern_local + 1,local_20), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool Str::wildCardMatch(const char* str, const char* pattern) {
  while (*pattern) {
    switch (*pattern) {
    case '?':
      if (!*str)
        return false;
      ++str;
      ++pattern;
      break;
    case '*':
      if (wildCardMatch(str, pattern + 1))
        return true;
      if (*str && wildCardMatch(str + 1, pattern))
        return true;
      return false;
    default:
      if (*str++ != *pattern++)
        return false;
      break;
    }
  }
  return !*str && !*pattern;
}